

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::MacroNode::MacroNode
          (MacroNode *this,Location *loc,shared_ptr<minja::VariableExpr> *n,Parameters *p,
          shared_ptr<minja::TemplateNode> *b)

{
  pointer ppVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  mapped_type *pmVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  
  TemplateNode::TemplateNode(&this->super_TemplateNode,loc);
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_0022f8a8;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  ppVar1 = (p->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (p->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (p->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->named_param_positions)._M_h._M_buckets =
       &(this->named_param_positions)._M_h._M_single_bucket;
  (this->named_param_positions)._M_h._M_bucket_count = 1;
  (this->named_param_positions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_positions)._M_h._M_element_count = 0;
  (this->named_param_positions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_param_positions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_param_positions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar6 = 0;
  for (uVar7 = 0;
      ppVar1 = (this->params).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(this->params).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x30);
      uVar7 = uVar7 + 1) {
    if (*(long *)((long)&(ppVar1->first)._M_string_length + lVar6) != 0) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->named_param_positions,
                            (key_type *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar6));
      *pmVar5 = uVar7;
    }
    lVar6 = lVar6 + 0x30;
  }
  return;
}

Assistant:

MacroNode(const Location & loc, std::shared_ptr<VariableExpr> && n, Expression::Parameters && p, std::shared_ptr<TemplateNode> && b)
        : TemplateNode(loc), name(std::move(n)), params(std::move(p)), body(std::move(b)) {
        for (size_t i = 0; i < params.size(); ++i) {
          const auto & name = params[i].first;
          if (!name.empty()) {
            named_param_positions[name] = i;
          }
        }
    }